

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void VP8LBackwardRefsClear(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  VP8LBackwardRefs *in_RDI;
  PixOrCopyBlock *next;
  
  VP8LClearBackwardRefs(in_RDI);
  while (in_RDI->free_blocks != (PixOrCopyBlock *)0x0) {
    pPVar1 = in_RDI->free_blocks->next;
    WebPSafeFree((void *)0x18df0e);
    in_RDI->free_blocks = pPVar1;
  }
  return;
}

Assistant:

void VP8LBackwardRefsClear(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  VP8LClearBackwardRefs(refs);
  while (refs->free_blocks != NULL) {
    PixOrCopyBlock* const next = refs->free_blocks->next;
    WebPSafeFree(refs->free_blocks);
    refs->free_blocks = next;
  }
}